

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::GetCompilePDBDirectory(string *__return_storage_ptr__,cmTarget *this,string *config)

{
  string *psVar1;
  allocator local_9;
  
  psVar1 = (string *)GetCompileInfo(this,config);
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetCompilePDBDirectory(const std::string& config) const
{
  if(CompileInfo const* info = this->GetCompileInfo(config))
    {
    return info->CompilePdbDir;
    }
  return "";
}